

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::convert_half_to_string_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t col,
          uint32_t row)

{
  CompilerError *this_00;
  char (*pacVar1) [12];
  char (*ts_1) [13];
  string *this_01;
  char (*in_R9) [2];
  float fVar2;
  spirv_cross local_1e0 [36];
  float local_1bc;
  string local_1b8;
  string local_198;
  undefined1 local_178 [208];
  uint *local_a8;
  size_t local_a0;
  size_t local_98;
  uint local_90 [8];
  undefined1 local_70 [28];
  TypeID local_54;
  __node_base_ptr *local_50;
  size_type local_48;
  __node_base local_40;
  size_type sStack_38;
  float local_30;
  size_t local_28;
  __node_base_ptr p_Stack_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  fVar2 = SPIRConstant::f16_to_f32(*(uint16_t *)((c->m).c[col].r + row));
  if (NAN(fVar2) || ABS(fVar2) == INFINITY) {
    local_178._32_8_ = local_178 + 0x38;
    local_178._8_4_ = 0;
    local_178._0_8_ = &PTR__SPIRType_0047ef28;
    local_178._12_4_ = 0x16;
    local_178._20_4_ = 0;
    local_178._40_8_ = 0;
    local_178._48_8_ = 8;
    local_178._88_8_ = local_178 + 0x70;
    local_178._96_8_ = 0;
    local_178._104_8_ = 8;
    local_178._120_4_ = 0;
    local_178[0x7c] = false;
    local_178[0x7d] = false;
    local_178._128_4_ = 0;
    local_178._132_4_ = 0;
    local_178._136_4_ = 0;
    local_178._140_4_ = 0;
    local_178._144_4_ = Generic;
    local_178._152_8_ = local_178 + 0xb0;
    local_178._160_8_ = 0;
    local_178._168_8_ = 8;
    local_a8 = local_90;
    local_a0 = 0;
    local_98 = 8;
    local_50 = &p_Stack_20;
    local_70._0_7_ = 0;
    local_70._7_4_ = 0;
    local_54.id = 0;
    local_70._12_4_ = 0;
    local_70._16_4_ = ImageFormatUnknown;
    local_70._20_4_ = AccessQualifierReadOnly;
    local_70._24_4_ = 0;
    local_48 = 1;
    local_40._M_nxt = (_Hash_node_base *)0x0;
    sStack_38 = 0;
    local_30 = 1.0;
    local_28 = 0;
    p_Stack_20 = (__node_base_ptr)0x0;
    local_178._16_4_ = Half;
    local_178._24_4_ = 1;
    local_178._28_4_ = 1;
    if (fVar2 < INFINITY) {
      if (-INFINITY < fVar2) {
        if (!NAN(fVar2)) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (this_00,"Cannot represent non-finite floating point constant.");
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        pacVar1 = (char (*) [12])0x0;
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1e0,this,local_178);
        join<std::__cxx11::string,char_const(&)[12]>
                  (&local_1b8,local_1e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "(0.0 / 0.0)",pacVar1);
      }
      else {
        ts_1 = (char (*) [13])0x0;
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1e0,this,local_178);
        join<std::__cxx11::string,char_const(&)[13]>
                  (&local_1b8,local_1e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "(-1.0 / 0.0)",ts_1);
      }
    }
    else {
      pacVar1 = (char (*) [12])0x0;
      (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1e0,this,local_178);
      join<std::__cxx11::string,char_const(&)[12]>
                (&local_1b8,local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(1.0 / 0.0)",
                 pacVar1);
    }
    this_01 = &local_1b8;
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)this_01);
  }
  else {
    local_178._32_8_ = local_178 + 0x38;
    local_178._8_4_ = 0;
    local_178._0_8_ = &PTR__SPIRType_0047ef28;
    local_178._12_4_ = 0x16;
    local_178._20_4_ = 0;
    local_178._40_8_ = 0;
    local_178._48_8_ = 8;
    local_178._88_8_ = local_178 + 0x70;
    local_178._96_8_ = 0;
    local_178._104_8_ = 8;
    local_178._120_4_ = 0;
    local_178[0x7c] = false;
    local_178[0x7d] = false;
    local_178._128_4_ = 0;
    local_178._132_4_ = 0;
    local_178._136_4_ = 0;
    local_178._140_4_ = 0;
    local_178._144_4_ = Generic;
    local_178._152_8_ = local_178 + 0xb0;
    local_178._160_8_ = 0;
    local_178._168_8_ = 8;
    local_a8 = local_90;
    local_a0 = 0;
    local_98 = 8;
    local_50 = &p_Stack_20;
    local_70._0_7_ = 0;
    local_70._7_4_ = 0;
    local_70._12_4_ = 0;
    local_70._16_4_ = ImageFormatUnknown;
    local_70._20_4_ = AccessQualifierReadOnly;
    local_70._24_4_ = 0;
    local_54.id = 0;
    local_48 = 1;
    local_40._M_nxt = (_Hash_node_base *)0x0;
    sStack_38 = 0;
    local_30 = 1.0;
    local_28 = 0;
    p_Stack_20 = (__node_base_ptr)0x0;
    local_178._16_4_ = Half;
    local_178._24_4_ = 1;
    local_178._28_4_ = 1;
    local_1bc = fVar2;
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1e0,this,local_178,0);
    format_float_abi_cxx11_(&local_198,this,local_1bc);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (&local_1b8,local_1e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3457d9,
               (char (*) [2])&local_198,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3511f2,in_R9);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1b8);
    ::std::__cxx11::string::~string((string *)&local_1b8);
    this_01 = &local_198;
  }
  ::std::__cxx11::string::~string((string *)this_01);
  ::std::__cxx11::string::~string((string *)local_1e0);
  SPIRType::~SPIRType((SPIRType *)local_178);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::convert_half_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	float float_value = c.scalar_f16(col, row);

	// There is no literal "hf" in GL_NV_gpu_shader5, so to avoid lots
	// of complicated workarounds, just value-cast to the half type always.
	if (std::isnan(float_value) || std::isinf(float_value))
	{
		SPIRType type { OpTypeFloat };
		type.basetype = SPIRType::Half;
		type.vecsize = 1;
		type.columns = 1;

		if (float_value == numeric_limits<float>::infinity())
			res = join(type_to_glsl(type), "(1.0 / 0.0)");
		else if (float_value == -numeric_limits<float>::infinity())
			res = join(type_to_glsl(type), "(-1.0 / 0.0)");
		else if (std::isnan(float_value))
			res = join(type_to_glsl(type), "(0.0 / 0.0)");
		else
			SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
	}
	else
	{
		SPIRType type { OpTypeFloat };
		type.basetype = SPIRType::Half;
		type.vecsize = 1;
		type.columns = 1;
		res = join(type_to_glsl(type), "(", format_float(float_value), ")");
	}

	return res;
}